

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int addk(FuncState *fs,TValue *key,TValue *v)

{
  ushort uVar1;
  Proto *o;
  lua_State *L;
  GCObject *pGVar2;
  int iVar3;
  TValue *pTVar4;
  int iVar5;
  LuaType *pLVar6;
  TValue *io;
  long lVar7;
  long lVar8;
  
  o = fs->f;
  L = fs->ls->L;
  pTVar4 = luaH_set(L,fs->ls->h,key);
  if ((pTVar4->tt_ == 0x13) && (iVar5 = (pTVar4->value_).b, iVar5 < fs->nk)) {
    if ((((v->tt_ ^ o->k[iVar5].tt_) & 0x7f) == 0) &&
       (iVar3 = luaV_equalobj((lua_State *)0x0,o->k + iVar5,v), iVar3 != 0)) {
      return iVar5;
    }
  }
  iVar5 = fs->nk;
  lVar7 = (long)o->sizek;
  lVar8 = (long)iVar5;
  (pTVar4->value_).i = lVar8;
  pTVar4->tt_ = 0x13;
  iVar3 = o->sizek;
  if (iVar3 <= iVar5) {
    pTVar4 = (TValue *)luaM_growaux_(L,o->k,&o->sizek,0x10,0xffffff,"constants");
    o->k = pTVar4;
    iVar3 = o->sizek;
  }
  pTVar4 = o->k;
  pLVar6 = &pTVar4[lVar7].tt_;
  for (; lVar7 < iVar3; lVar7 = lVar7 + 1) {
    *pLVar6 = 0;
    pLVar6 = pLVar6 + 8;
  }
  pGVar2 = (v->value_).gc;
  pTVar4[lVar8].value_.gc = pGVar2;
  uVar1 = v->tt_;
  pTVar4[lVar8].tt_ = uVar1;
  if ((short)uVar1 < 0) {
    if (((uVar1 & 0x7f) != (ushort)pGVar2->tt) ||
       ((L != (lua_State *)0x0 && ((pGVar2->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                    ,0x1cc,"int addk(FuncState *, TValue *, TValue *)");
    }
    fs->nk = fs->nk + 1;
    if (((o->marked & 0x20) != 0) && ((((v->value_).gc)->marked & 0x18) != 0)) {
      if (9 < (o->tt & 0xe)) {
        __assert_fail("(((f)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x1ce,"int addk(FuncState *, TValue *, TValue *)");
      }
      luaC_barrier_(L,(GCObject *)o,(v->value_).gc);
    }
  }
  else {
    fs->nk = fs->nk + 1;
  }
  return iVar5;
}

Assistant:

static int addk (FuncState *fs, TValue *key, TValue *v) {
  lua_State *L = fs->ls->L;
  Proto *f = fs->f;
  TValue *idx = luaH_set(L, fs->ls->h, key);  /* index scanner table */
  int k, oldsize;
  if (ttisinteger(idx)) {  /* is there an index there? */
    k = cast_int(ivalue(idx));
    /* correct value? (warning: must distinguish floats from integers!) */
    if (k < fs->nk && ttype(&f->k[k]) == ttype(v) &&
                      luaV_rawequalobj(&f->k[k], v))
      return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  oldsize = f->sizek;
  k = fs->nk;
  /* numerical value does not need GC barrier;
     table has no metatable, so it does not need to invalidate cache */
  setivalue(idx, k);
  luaM_growvector(L, f->k, k, f->sizek, TValue, MAXARG_Ax, "constants");
  while (oldsize < f->sizek) setnilvalue(&f->k[oldsize++]);
  setobj(L, &f->k[k], v);
  fs->nk++;
  luaC_barrier(L, f, v);
  return k;
}